

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUIEditBox::getCursorPos(CGUIEditBox *this,s32 x,s32 y)

{
  u32 uVar1;
  long *plVar2;
  int *piVar3;
  wchar_t *pwVar4;
  int in_EDX;
  int in_ESI;
  CGUIEditBox *in_RDI;
  s32 idx;
  u32 i;
  s32 startPos;
  stringw *txtLine;
  u32 lineCount;
  IGUIFont *font;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string<wchar_t> *local_58;
  uint local_4c;
  uint local_38;
  int local_34;
  string<wchar_t> *local_30;
  int local_18;
  CGUIEditBox *this_00;
  int local_4;
  
  this_00 = in_RDI;
  plVar2 = (long *)(**(code **)(*(long *)in_RDI + 0x130))();
  if (((in_RDI->WordWrap & 1U) == 0) && ((in_RDI->MultiLine & 1U) == 0)) {
    local_4c = 1;
  }
  else {
    local_4c = core::array<irr::core::string<wchar_t>_>::size
                         ((array<irr::core::string<wchar_t>_> *)0x3aa509);
  }
  local_30 = (string<wchar_t> *)0x0;
  local_34 = 0;
  in_ESI = in_ESI + 3;
  local_38 = 0;
  local_18 = in_EDX;
  do {
    if (local_4c <= local_38) {
LAB_003aa691:
      if (in_ESI < (in_RDI->CurrentTextRect).UpperLeftCorner.X) {
        in_ESI = (in_RDI->CurrentTextRect).UpperLeftCorner.X;
      }
      if (local_30 == (string<wchar_t> *)0x0) {
        local_4 = 0;
      }
      else {
        pwVar4 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3aa6d6);
        local_4 = (**(code **)(*plVar2 + 0x10))
                            (plVar2,pwVar4,in_ESI - (in_RDI->CurrentTextRect).UpperLeftCorner.X);
        if (local_4 == -1) {
          uVar1 = core::string<wchar_t>::size((string<wchar_t> *)0x3aa715);
          local_4 = uVar1 + local_34;
        }
        else {
          local_4 = local_4 + local_34;
        }
      }
      return local_4;
    }
    setTextRect(this_00,in_ESI);
    uVar1 = (u32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if ((local_38 == 0) && (local_18 < (in_RDI->CurrentTextRect).UpperLeftCorner.Y)) {
      local_18 = (in_RDI->CurrentTextRect).UpperLeftCorner.Y;
    }
    if ((local_38 == local_4c - 1) && ((in_RDI->CurrentTextRect).LowerRightCorner.Y < local_18)) {
      local_18 = (in_RDI->CurrentTextRect).LowerRightCorner.Y;
    }
    if (((in_RDI->CurrentTextRect).UpperLeftCorner.Y <= local_18) &&
       (local_18 <= (in_RDI->CurrentTextRect).LowerRightCorner.Y)) {
      if (((in_RDI->WordWrap & 1U) == 0) && ((in_RDI->MultiLine & 1U) == 0)) {
        local_58 = (string<wchar_t> *)&in_RDI->field_0xa8;
      }
      else {
        local_58 = core::array<irr::core::string<wchar_t>_>::operator[]
                             ((array<irr::core::string<wchar_t>_> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),uVar1);
      }
      local_30 = local_58;
      if (((in_RDI->WordWrap & 1U) == 0) && ((in_RDI->MultiLine & 1U) == 0)) {
        local_34 = 0;
      }
      else {
        piVar3 = core::array<int>::operator[]
                           ((array<int> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),uVar1);
        local_34 = *piVar3;
      }
      goto LAB_003aa691;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

s32 CGUIEditBox::getCursorPos(s32 x, s32 y)
{
	IGUIFont *font = getActiveFont();

	const u32 lineCount = (WordWrap || MultiLine) ? BrokenText.size() : 1;

	core::stringw *txtLine = 0;
	s32 startPos = 0;
	x += 3;

	for (u32 i = 0; i < lineCount; ++i) {
		setTextRect(i);
		if (i == 0 && y < CurrentTextRect.UpperLeftCorner.Y)
			y = CurrentTextRect.UpperLeftCorner.Y;
		if (i == lineCount - 1 && y > CurrentTextRect.LowerRightCorner.Y)
			y = CurrentTextRect.LowerRightCorner.Y;

		// is it inside this region?
		if (y >= CurrentTextRect.UpperLeftCorner.Y && y <= CurrentTextRect.LowerRightCorner.Y) {
			// we've found the clicked line
			txtLine = (WordWrap || MultiLine) ? &BrokenText[i] : &Text;
			startPos = (WordWrap || MultiLine) ? BrokenTextPositions[i] : 0;
			break;
		}
	}

	if (x < CurrentTextRect.UpperLeftCorner.X)
		x = CurrentTextRect.UpperLeftCorner.X;

	if (!txtLine)
		return 0;

	s32 idx = font->getCharacterFromPos(txtLine->c_str(), x - CurrentTextRect.UpperLeftCorner.X);

	// click was on or left of the line
	if (idx != -1)
		return idx + startPos;

	// click was off the right edge of the line, go to end.
	return txtLine->size() + startPos;
}